

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdoc.c
# Opt level: O2

void prvTidyCleanGoogleDocument(TidyDocImpl *doc)

{
  Node *element;
  Node *node;
  
  CleanNode(doc,&doc->root);
  element = prvTidyFindHEAD(doc);
  if (element != (Node *)0x0) {
    node = prvTidyInferredTag(doc,TidyTag_META);
    prvTidyAddAttribute(doc,node,"http-equiv","Content-Type");
    prvTidyAddAttribute(doc,node,"content","text/html; charset=UTF-8");
    prvTidyInsertNodeAtStart(element,node);
    return;
  }
  return;
}

Assistant:

void TY_(CleanGoogleDocument)( TidyDocImpl* doc )
{
    /* placeholder.  CleanTree()/CleanNode() will not
    ** zap root element 
    */
    CleanNode( doc, &doc->root );
    SetUTF8( doc );
}